

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleFactory::updateVisibleIDs(SimpleFactory *this,Hashtable *result,UErrorCode *status)

{
  UHashtable *hash;
  UnicodeString *this_00;
  
  if (this->_visible != '\0') {
    hash = result->hash;
    this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)result);
    if (this_00 != (UnicodeString *)0x0) {
      icu_63::UnicodeString::UnicodeString(this_00,&this->_id);
    }
    uhash_put_63(hash,this_00,this,status);
    return;
  }
  uhash_remove_63(result->hash,&this->_id);
  return;
}

Assistant:

void 
SimpleFactory::updateVisibleIDs(Hashtable& result, UErrorCode& status) const 
{
    if (_visible) {
        result.put(_id, (void*)this, status); // cast away const
    } else {
        result.remove(_id);
    }
}